

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::InstancedRenderingCase::init
          (InstancedRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  TestError *this_01;
  int precision;
  int precision_00;
  int precision_01;
  int precision_02;
  float fVar8;
  int local_bb8;
  int local_bb4;
  int j_3;
  int i_4;
  int bInstances;
  int j_2;
  int i_3;
  int gInstances;
  int j_1;
  int i_2;
  int rInstances;
  float local_b8c;
  int j;
  float local_b84;
  int i_1;
  float fy1;
  float fy0;
  float fx1;
  float fx0;
  int x_2;
  int y_2;
  value_type_conflict3 local_b64;
  value_type_conflict3 local_b62;
  int local_b60;
  int local_b5c;
  int ndx11;
  int ndx01;
  int ndx10;
  int ndx00;
  int x_1;
  int y_1;
  float fy;
  float fx;
  int x;
  int y;
  TestLog *log;
  string local_b28;
  ProgramSources local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  undefined1 local_918 [8];
  string vertShaderSourceStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  byte local_571;
  string local_570;
  byte local_54a;
  allocator<char> local_549;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  int local_384;
  undefined1 local_380 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  string colorBExpression;
  string colorGExpression;
  string colorRExpression;
  string posExpression;
  string instanceAttribs;
  undefined1 local_220 [8];
  string numInstancesStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string floatUintBiasStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string floatUintScaleStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string floatIntBiasStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string floatIntScaleStr;
  undefined1 local_78 [8];
  string typeName;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string swizzleFirst;
  bool isScalarCase;
  int typeSize;
  bool isMatCase;
  bool isUintCase;
  bool isIntCase;
  bool isFloatCase;
  InstancedRenderingCase *this_local;
  
  bVar1 = glu::isDataTypeFloatOrVec(this->m_rgbAttrType);
  bVar2 = glu::isDataTypeIntOrIVec(this->m_rgbAttrType);
  bVar3 = glu::isDataTypeUintOrUVec(this->m_rgbAttrType);
  bVar4 = glu::isDataTypeMatrix(this->m_rgbAttrType);
  iVar5 = glu::getDataTypeScalarSize(this->m_rgbAttrType);
  swizzleFirst.field_2._M_local_buf[0xf] = iVar5 == 1;
  pcVar7 = ".x";
  if ((bool)swizzleFirst.field_2._M_local_buf[0xf]) {
    pcVar7 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pcVar7,&local_41);
  std::allocator<char>::~allocator(&local_41);
  pcVar7 = glu::getDataTypeName(this->m_rgbAttrType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,pcVar7,
             (allocator<char> *)(floatIntScaleStr.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(floatIntScaleStr.field_2._M_local_buf + 0xf))
  ;
  de::floatToString_abi_cxx11_
            ((string *)((long)&floatIntBiasStr.field_2 + 8),(de *)0x3,100.0,precision);
  std::operator+(&local_c0,"(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&floatIntBiasStr.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,")");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(floatIntBiasStr.field_2._M_local_buf + 8));
  de::floatToString_abi_cxx11_
            ((string *)((long)&floatUintScaleStr.field_2 + 8),(de *)0x3,-50.0,precision_00);
  std::operator+(&local_120,"(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&floatUintScaleStr.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_120,")");
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)(floatUintScaleStr.field_2._M_local_buf + 8));
  de::floatToString_abi_cxx11_
            ((string *)((long)&floatUintBiasStr.field_2 + 8),(de *)0x3,100.0,precision_01);
  std::operator+(&local_180,"(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&floatUintBiasStr.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &local_180,")");
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)(floatUintBiasStr.field_2._M_local_buf + 8));
  de::floatToString_abi_cxx11_
            ((string *)((long)&numInstancesStr.field_2 + 8),(de *)0x3,0.0,precision_02);
  std::operator+(&local_1e0,"(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&numInstancesStr.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 &local_1e0,")");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)(numInstancesStr.field_2._M_local_buf + 8));
  de::toString<int>((string *)((long)&instanceAttribs.field_2 + 8),&this->m_numInstances);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&instanceAttribs.field_2 + 8),".0");
  std::__cxx11::string::~string((string *)(instanceAttribs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(posExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(colorRExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(colorGExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(colorBExpression.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_2e0);
  if ((this->m_instancingType == TYPE_INSTANCE_ID) || (this->m_instancingType == TYPE_MIXED)) {
    std::operator+(&local_320,"a_position + vec4(float(gl_InstanceID) * 2.0 / ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    std::operator+(&local_300,&local_320,", 0.0, 0.0, 0.0)");
    std::__cxx11::string::operator=
              ((string *)(colorRExpression.field_2._M_local_buf + 8),(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    std::operator+(&local_340,"float(gl_InstanceID)/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    std::__cxx11::string::operator=
              ((string *)(colorGExpression.field_2._M_local_buf + 8),(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    if (this->m_instancingType == TYPE_INSTANCE_ID) {
      std::operator+(&local_360,"float(gl_InstanceID)*2.0/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
      ;
      std::__cxx11::string::operator=
                ((string *)(colorBExpression.field_2._M_local_buf + 8),(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
                     "1.0 - float(gl_InstanceID)/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
      ;
      std::__cxx11::string::operator=((string *)local_2e0,(string *)local_380);
      std::__cxx11::string::~string((string *)local_380);
    }
  }
  if ((this->m_instancingType == TYPE_ATTRIB_DIVISOR) || (this->m_instancingType == TYPE_MIXED)) {
    if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
      std::__cxx11::string::operator=
                ((string *)(colorRExpression.field_2._M_local_buf + 8),
                 "a_position + vec4(a_instanceOffset");
      for (local_384 = 0; local_384 < 1; local_384 = local_384 + 1) {
        std::__cxx11::string::operator+=
                  ((string *)(colorRExpression.field_2._M_local_buf + 8),", 0.0");
      }
      std::__cxx11::string::operator+=((string *)(colorRExpression.field_2._M_local_buf + 8),")");
      if (bVar1) {
        std::operator+(&local_3a8,"a_instanceR",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::__cxx11::string::operator=
                  ((string *)(colorGExpression.field_2._M_local_buf + 8),(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
      }
      else if (bVar2) {
        std::operator+(&local_448,"(float(a_instanceR",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_428,&local_448,") - ");
        std::operator+(&local_408,&local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
        std::operator+(&local_3e8,&local_408,") / ");
        std::operator+(&local_3c8,&local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        std::__cxx11::string::operator=
                  ((string *)(colorGExpression.field_2._M_local_buf + 8),(string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
      }
      else if (bVar3) {
        std::operator+(&local_4e8,"(float(a_instanceR",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_4c8,&local_4e8,") - ");
        std::operator+(&local_4a8,&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0);
        std::operator+(&local_488,&local_4a8,") / ");
        std::operator+(&local_468,&local_488,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160);
        std::__cxx11::string::operator=
                  ((string *)(colorGExpression.field_2._M_local_buf + 8),(string *)&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
      }
      else if (bVar4) {
        std::__cxx11::string::operator=
                  ((string *)(colorGExpression.field_2._M_local_buf + 8),"a_instanceR[0][0]");
      }
      local_54a = 0;
      local_571 = 0;
      de::toString<int>(&local_570,&OFFSET_COMPONENTS);
      local_571 = 1;
      std::operator+(&local_548,"vec",&local_570);
      std::operator+(&local_528,"in highp ",&local_548);
      std::operator+(&local_508,&local_528," a_instanceOffset;\n");
      std::__cxx11::string::operator+=
                ((string *)(posExpression.field_2._M_local_buf + 8),(string *)&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      if ((local_571 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_570);
      }
      if ((local_54a & 1) != 0) {
        std::allocator<char>::~allocator(&local_549);
      }
      std::operator+(&local_5b8,"in mediump ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_598,&local_5b8," a_instanceR;\n");
      std::__cxx11::string::operator+=
                ((string *)(posExpression.field_2._M_local_buf + 8),(string *)&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
    }
    if (bVar1) {
      std::operator+(&local_5d8,"a_instanceG",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=
                ((string *)(colorBExpression.field_2._M_local_buf + 8),(string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::operator+(&local_5f8,"a_instanceB",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_5f8);
    }
    else if (bVar2) {
      std::operator+(&local_698,"(float(a_instanceG",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_678,&local_698,") - ");
      std::operator+(&local_658,&local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      std::operator+(&local_638,&local_658,") / ");
      std::operator+(&local_618,&local_638,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::operator=
                ((string *)(colorBExpression.field_2._M_local_buf + 8),(string *)&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      std::operator+(&local_738,"(float(a_instanceB",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_718,&local_738,") - ");
      std::operator+(&local_6f8,&local_718,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      std::operator+(&local_6d8,&local_6f8,") / ");
      std::operator+(&local_6b8,&local_6d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
    }
    else if (bVar3) {
      std::operator+(&local_7d8,"(float(a_instanceG",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_7b8,&local_7d8,") - ");
      std::operator+(&local_798,&local_7b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0)
      ;
      std::operator+(&local_778,&local_798,") / ");
      std::operator+(&local_758,&local_778,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::__cxx11::string::operator=
                ((string *)(colorBExpression.field_2._M_local_buf + 8),(string *)&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::operator+(&local_878,"(float(a_instanceB",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_858,&local_878,") - ");
      std::operator+(&local_838,&local_858,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0)
      ;
      std::operator+(&local_818,&local_838,") / ");
      std::operator+(&local_7f8,&local_818,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_878);
    }
    else if (bVar4) {
      std::__cxx11::string::operator=
                ((string *)(colorBExpression.field_2._M_local_buf + 8),"a_instanceG[0][0]");
      std::__cxx11::string::operator=((string *)local_2e0,"a_instanceB[0][0]");
    }
    std::operator+(&local_8b8,"in mediump ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::operator+(&local_898,&local_8b8," a_instanceG;\n");
    std::__cxx11::string::operator+=
              ((string *)(posExpression.field_2._M_local_buf + 8),(string *)&local_898);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vertShaderSourceStr.field_2 + 8),"in mediump ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::operator+(&local_8d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vertShaderSourceStr.field_2 + 8)," a_instanceB;\n");
    std::__cxx11::string::operator+=
              ((string *)(posExpression.field_2._M_local_buf + 8),(string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)(vertShaderSourceStr.field_2._M_local_buf + 8));
  }
  std::operator+(&local_a38,"#version 300 es\nin highp vec4 a_position;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&posExpression.field_2 + 8));
  std::operator+(&local_a18,&local_a38,
                 "out mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = ");
  std::operator+(&local_9f8,&local_a18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&colorRExpression.field_2 + 8));
  std::operator+(&local_9d8,&local_9f8,";\n\tv_color.r = ");
  std::operator+(&local_9b8,&local_9d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&colorGExpression.field_2 + 8));
  std::operator+(&local_998,&local_9b8,";\n\tv_color.g = ");
  std::operator+(&local_978,&local_998,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&colorBExpression.field_2 + 8));
  std::operator+(&local_958,&local_978,";\n\tv_color.b = ");
  std::operator+(&local_938,&local_958,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918,
                 &local_938,";\n\tv_color.a = 1.0;\n}\n");
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  log._6_1_ = 1;
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar7 = init::fragShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b28,pcVar7,(allocator<char> *)((long)&log + 7));
  glu::makeVtxFragSources(&local_b08,(string *)local_918,&local_b28);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_b08);
  log._6_1_ = 0;
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_b08);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  _x = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(_x,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar1) {
    if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
      for (fx = 0.0; (int)fx < 0x80; fx = (float)((int)fx + 1)) {
        for (fy = 0.0; (int)fy < 0x80; fy = (float)((int)fy + 1)) {
          y_1 = (int)(((float)(int)fy / 127.0 + (float)(int)fy / 127.0) /
                      (float)this->m_numInstances + -1.0);
          x_1 = (int)((float)(int)fx / 127.0 + (float)(int)fx / 127.0 + -1.0);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,(value_type_conflict2 *)&y_1);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,(value_type_conflict2 *)&x_1);
        }
      }
      for (ndx00 = 0; ndx00 < 0x7f; ndx00 = ndx00 + 1) {
        for (ndx10 = 0; ndx10 < 0x7f; ndx10 = ndx10 + 1) {
          ndx01 = ndx00 * 0x80 + ndx10;
          ndx11 = ndx00 * 0x80 + 1 + ndx10;
          local_b5c = ndx00 * 0x80 + 0x80 + ndx10;
          local_b60 = ndx00 * 0x80 + 0x81 + ndx10;
          local_b62 = (value_type_conflict3)ndx01;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,&local_b62);
          local_b64 = (value_type_conflict3)ndx11;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,&local_b64);
          y_2._2_2_ = (undefined2)local_b5c;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,(value_type_conflict3 *)((long)&y_2 + 2));
          y_2._0_2_ = (undefined2)local_b60;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,(value_type_conflict3 *)&y_2);
          x_2._2_2_ = (undefined2)local_b5c;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,(value_type_conflict3 *)((long)&x_2 + 2));
          x_2._0_2_ = (value_type_conflict3)ndx11;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_gridIndices,(value_type_conflict3 *)&x_2);
        }
      }
    }
    else {
      for (fx0 = 0.0; (int)fx0 < 0x7f; fx0 = (float)((int)fx0 + 1)) {
        for (fx1 = 0.0; (int)fx1 < 0x7f; fx1 = (float)((int)fx1 + 1)) {
          fy0 = ((float)(int)fx1 / 127.0 + (float)(int)fx1 / 127.0) / (float)this->m_numInstances +
                -1.0;
          fVar8 = (float)((int)fx1 + 1) / 127.0;
          fy1 = (fVar8 + fVar8) / (float)this->m_numInstances + -1.0;
          i_1 = (int)((float)(int)fx0 / 127.0 + (float)(int)fx0 / 127.0 + -1.0);
          fVar8 = (float)((int)fx0 + 1) / 127.0;
          local_b84 = fVar8 + fVar8 + -1.0;
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy0);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,(value_type_conflict2 *)&i_1);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy1);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,(value_type_conflict2 *)&i_1);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy0);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,&local_b84);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy1);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,&local_b84);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy0);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,&local_b84);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_gridVertexPositions,&fy1);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_gridVertexPositions,(value_type_conflict2 *)&i_1);
        }
      }
    }
    if ((this->m_instancingType == TYPE_ATTRIB_DIVISOR) || (this->m_instancingType == TYPE_MIXED)) {
      if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
        for (j = 0; j < this->m_numInstances; j = j + 1) {
          local_b8c = ((float)j + (float)j) / (float)this->m_numInstances;
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_instanceOffsets,&local_b8c)
          ;
          for (rInstances = 0; rInstances < 2; rInstances = rInstances + 1) {
            i_2 = 0;
            std::vector<float,_std::allocator<float>_>::push_back
                      (&this->m_instanceOffsets,(value_type_conflict2 *)&i_2);
          }
        }
        iVar6 = this->m_numInstances / 3 + (uint)(this->m_numInstances % 3 != 0);
        for (gInstances = 0; gInstances < iVar6; gInstances = gInstances + 1) {
          pushVarCompAttrib(this,&this->m_instanceColorR,(float)gInstances / (float)iVar6);
          for (i_3 = 0; i_3 < iVar5 + -1; i_3 = i_3 + 1) {
            pushVarCompAttrib(this,&this->m_instanceColorR,0.0);
          }
        }
      }
      iVar6 = this->m_numInstances / 2 + (uint)(this->m_numInstances % 2 != 0);
      for (bInstances = 0; bInstances < iVar6; bInstances = bInstances + 1) {
        pushVarCompAttrib(this,&this->m_instanceColorG,
                          ((float)bInstances + (float)bInstances) / (float)iVar6);
        for (i_4 = 0; i_4 < iVar5 + -1; i_4 = i_4 + 1) {
          pushVarCompAttrib(this,&this->m_instanceColorG,0.0);
        }
      }
      iVar6 = this->m_numInstances / 1 + (uint)(this->m_numInstances % 1 != 0);
      for (local_bb4 = 0; local_bb4 < iVar6; local_bb4 = local_bb4 + 1) {
        pushVarCompAttrib(this,&this->m_instanceColorB,1.0 - (float)local_bb4 / (float)iVar6);
        for (local_bb8 = 0; local_bb8 < iVar5 + -1; local_bb8 = local_bb8 + 1) {
          pushVarCompAttrib(this,&this->m_instanceColorB,0.0);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_918);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)(colorBExpression.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(colorGExpression.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(colorRExpression.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(posExpression.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
    iVar5 = std::__cxx11::string::~string((string *)local_40);
    return iVar5;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fInstancedRenderingTests.cpp"
             ,0x136);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InstancedRenderingCase::init (void)
{
	bool	isFloatCase			= glu::isDataTypeFloatOrVec(m_rgbAttrType);
	bool	isIntCase			= glu::isDataTypeIntOrIVec(m_rgbAttrType);
	bool	isUintCase			= glu::isDataTypeUintOrUVec(m_rgbAttrType);
	bool	isMatCase			= glu::isDataTypeMatrix(m_rgbAttrType);
	int		typeSize			= glu::getDataTypeScalarSize(m_rgbAttrType);
	bool	isScalarCase		= typeSize == 1;
	string	swizzleFirst		= isScalarCase ? "" : ".x";
	string	typeName			= glu::getDataTypeName(m_rgbAttrType);

	string	floatIntScaleStr	= "(" + de::floatToString(FLOAT_INT_SCALE, 3) + ")";
	string	floatIntBiasStr		= "(" + de::floatToString(FLOAT_INT_BIAS, 3) + ")";
	string	floatUintScaleStr	= "(" + de::floatToString(FLOAT_UINT_SCALE, 3) + ")";
	string	floatUintBiasStr	= "(" + de::floatToString(FLOAT_UINT_BIAS, 3) + ")";

	DE_ASSERT(isFloatCase || isIntCase || isUintCase || isMatCase);

	// Generate shader.
	// \note For case TYPE_MIXED, vertex position offset and color red component get their values from instance id, while green and blue get their values from instanced attributes.

	string numInstancesStr = de::toString(m_numInstances) + ".0";

	string instanceAttribs;
	string posExpression;
	string colorRExpression;
	string colorGExpression;
	string colorBExpression;

	if (m_instancingType == TYPE_INSTANCE_ID || m_instancingType == TYPE_MIXED)
	{
		posExpression = "a_position + vec4(float(gl_InstanceID) * 2.0 / " + numInstancesStr + ", 0.0, 0.0, 0.0)";
		colorRExpression = "float(gl_InstanceID)/" + numInstancesStr;

		if (m_instancingType == TYPE_INSTANCE_ID)
		{
			colorGExpression = "float(gl_InstanceID)*2.0/" + numInstancesStr;
			colorBExpression = "1.0 - float(gl_InstanceID)/" + numInstancesStr;
		}
	}

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			posExpression = "a_position + vec4(a_instanceOffset";

			DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

			for (int i = 0; i < 4-OFFSET_COMPONENTS; i++)
				posExpression += ", 0.0";
			posExpression += ")";

			if (isFloatCase)
				colorRExpression = "a_instanceR" + swizzleFirst;
			else if (isIntCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			else if (isUintCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			else if (isMatCase)
				colorRExpression = "a_instanceR[0][0]";
			else
				DE_ASSERT(DE_FALSE);

			instanceAttribs += "in highp " + (OFFSET_COMPONENTS == 1 ? string("float") : "vec" + de::toString(OFFSET_COMPONENTS)) + " a_instanceOffset;\n";
			instanceAttribs += "in mediump " + typeName + " a_instanceR;\n";
		}

		if (isFloatCase)
		{
			colorGExpression = "a_instanceG" + swizzleFirst;
			colorBExpression = "a_instanceB" + swizzleFirst;
		}
		else if (isIntCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
		}
		else if (isUintCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
		}
		else if (isMatCase)
		{
			colorGExpression = "a_instanceG[0][0]";
			colorBExpression = "a_instanceB[0][0]";
		}
		else
			DE_ASSERT(DE_FALSE);

		instanceAttribs += "in mediump " + typeName + " a_instanceG;\n";
		instanceAttribs += "in mediump " + typeName + " a_instanceB;\n";
	}

	DE_ASSERT(!posExpression.empty());
	DE_ASSERT(!colorRExpression.empty());
	DE_ASSERT(!colorGExpression.empty());
	DE_ASSERT(!colorBExpression.empty());

	std::string vertShaderSourceStr =
		"#version 300 es\n"
		"in highp vec4 a_position;\n" +
		instanceAttribs +
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = " + posExpression + ";\n"
		"	v_color.r = " + colorRExpression + ";\n"
		"	v_color.g = " + colorGExpression + ";\n"
		"	v_color.b = " + colorBExpression + ";\n"
		"	v_color.a = 1.0;\n"
		"}\n";

	static const char* fragShaderSource =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	// Create shader program and log it.

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertShaderSourceStr, fragShaderSource));

	tcu::TestLog& log = m_testCtx.getLog();

	log << *m_program;

	if(!m_program->isOk())
		TCU_FAIL("Failed to compile shader");

	// Vertex shader attributes.

	if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
	{
		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE + 1; y++)
			for (int x = 0; x < QUAD_GRID_SIZE + 1; x++)
			{
				float fx = -1.0f + (float)x / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy = -1.0f + (float)y / (float)QUAD_GRID_SIZE * 2.0f;

				m_gridVertexPositions.push_back(fx);
				m_gridVertexPositions.push_back(fy);
			}

		// Indices.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				int ndx00 = y*(QUAD_GRID_SIZE + 1) + x;
				int ndx10 = y*(QUAD_GRID_SIZE + 1) + x + 1;
				int ndx01 = (y + 1)*(QUAD_GRID_SIZE + 1) + x;
				int ndx11 = (y + 1)*(QUAD_GRID_SIZE + 1) + x + 1;

				// Lower-left triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx00);
				m_gridIndices.push_back((deUint16)ndx10);
				m_gridIndices.push_back((deUint16)ndx01);

				// Upper-right triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx11);
				m_gridIndices.push_back((deUint16)ndx01);
				m_gridIndices.push_back((deUint16)ndx10);
			}
	}
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_ARRAYS_INSTANCED);

		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				float fx0 = -1.0f + (float)(x+0) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fx1 = -1.0f + (float)(x+1) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy0 = -1.0f + (float)(y+0) / (float)QUAD_GRID_SIZE * 2.0f;
				float fy1 = -1.0f + (float)(y+1) / (float)QUAD_GRID_SIZE * 2.0f;

				// Vertices of a quad's lower-left triangle: (fx0, fy0), (fx1, fy0) and (fx0, fy1)
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);

				// Vertices of a quad's upper-right triangle: (fx1, fy1), (fx0, fy1) and (fx1, fy0)
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
			}
	}

	// Instanced attributes: position offset and color RGB components.

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			// Offsets are such that the vertical bars are drawn next to each other.
			for (int i = 0; i < m_numInstances; i++)
			{
				m_instanceOffsets.push_back((float)i * 2.0f / (float)m_numInstances);

				DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

				for (int j = 0; j < OFFSET_COMPONENTS-1; j++)
					m_instanceOffsets.push_back(0.0f);
			}

			int rInstances = m_numInstances / ATTRIB_DIVISOR_R + (m_numInstances % ATTRIB_DIVISOR_R == 0 ? 0 : 1);
			for (int i = 0; i < rInstances; i++)
			{
				pushVarCompAttrib(m_instanceColorR, (float)i / (float)rInstances);

				for (int j = 0; j < typeSize - 1; j++)
					pushVarCompAttrib(m_instanceColorR, 0.0f);
			}
		}

		int gInstances = m_numInstances / ATTRIB_DIVISOR_G + (m_numInstances % ATTRIB_DIVISOR_G == 0 ? 0 : 1);
		for (int i = 0; i < gInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorG, (float)i*2.0f / (float)gInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorG, 0.0f);
		}

		int bInstances = m_numInstances / ATTRIB_DIVISOR_B + (m_numInstances % ATTRIB_DIVISOR_B == 0 ? 0 : 1);
		for (int i = 0; i < bInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorB, 1.0f - (float)i / (float)bInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorB, 0.0f);
		}
	}
}